

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

char * duckdb_snappy::internal::CompressFragmentDoubleHash
                 (char *input,size_t input_size,char *op,uint16_t *table,int table_size,
                 uint16_t *table2,int table_size2)

{
  long *plVar1;
  long *plVar2;
  ushort uVar3;
  bool bVar4;
  short sVar5;
  short sVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong unaff_RBP;
  uint uVar12;
  int iVar13;
  uint uVar14;
  long *plVar15;
  long *plVar16;
  uint *puVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  long *__src;
  uint *puVar22;
  char *unaff_R13;
  ulong uVar23;
  long *plVar24;
  ulong uVar25;
  long lVar26;
  
  plVar2 = (long *)(input + input_size);
  iVar19 = (int)plVar2;
  __src = (long *)input;
  if (input_size < 0xf) {
LAB_001f2ea1:
    if (__src < plVar2) {
      iVar19 = iVar19 - (int)__src;
      uVar8 = iVar19 - 1;
      if (iVar19 < 0x3d) {
        *op = (char)uVar8 << 2;
      }
      else {
        uVar14 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> uVar14 == 0; uVar14 = uVar14 - 1) {
          }
        }
        uVar14 = -(uint)(uVar8 == 0) | (uVar14 ^ 0x18) >> 3 ^ 3;
        *op = (char)uVar14 * '\x04' + -0x10;
        *(uint *)((long)op + 1) = uVar8;
        op = (char *)((long)op + (long)(int)uVar14 + 1);
      }
      switchD_00b1422a::default((void *)((long)op + 1),__src,(long)iVar19);
      op = (char *)((long)op + (long)iVar19 + 1U);
    }
    return (char *)(uint *)op;
  }
  uVar8 = table_size * 2 - 2;
  plVar1 = plVar2 + -1;
  plVar24 = (long *)input;
LAB_001f2745:
  __src = (long *)((long)plVar24 + 1);
  lVar26 = *(long *)((long)plVar24 + 1);
  uVar25 = 0x200;
LAB_001f2758:
  plVar15 = (long *)((uVar25 >> 9) + (long)__src);
  if (plVar15 <= (long *)((long)plVar2 - 0xfU)) {
    uVar23 = (ulong)((uint)((ulong)(lVar26 * 0xcf1bbcdcbfa563) >> 0x31) & uVar8);
    uVar3 = *(ushort *)(uVar23 + (long)table2);
    sVar5 = (short)__src - (short)input;
    *(short *)(uVar23 + (long)table2) = sVar5;
    iVar11 = (int)lVar26;
    if (*(int *)(input + uVar3) == iVar11) {
      pcVar7 = input + uVar3;
      plVar15 = (long *)((long)__src + 4);
      uVar23 = 0;
      if (plVar15 <= plVar1) {
        uVar23 = 0;
LAB_001f27f2:
        if (*(ulong *)((long)plVar15 + uVar23) == *(ulong *)(pcVar7 + uVar23 + 4))
        goto code_r0x001f2803;
        uVar10 = *(ulong *)(pcVar7 + uVar23 + 4) ^ *(ulong *)((long)plVar15 + uVar23);
        uVar18 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
          }
        }
        iVar11 = (int)uVar23 + ((uint)(uVar18 >> 3) & 0x1fffffff);
        goto LAB_001f291b;
      }
      goto LAB_001f2817;
    }
    uVar23 = (ulong)((uint)(iVar11 * -0x61c8864f) >> 0x11 & uVar8);
    uVar3 = *(ushort *)(uVar23 + (long)table);
    pcVar7 = input + uVar3;
    *(short *)(uVar23 + (long)table) = sVar5;
    if (*(int *)(input + uVar3) != iVar11) {
      lVar26 = *plVar15;
      iVar11 = 0;
      bVar4 = true;
      __src = plVar15;
      unaff_R13 = pcVar7;
      goto LAB_001f27c6;
    }
    plVar15 = (long *)((long)__src + 4);
    uVar23 = 0;
    if (plVar15 <= plVar1) {
      uVar23 = 0;
LAB_001f2885:
      if (*(ulong *)((long)plVar15 + uVar23) == *(ulong *)(pcVar7 + uVar23 + 4))
      goto code_r0x001f2897;
      uVar10 = *(ulong *)(pcVar7 + uVar23 + 4) ^ *(ulong *)((long)plVar15 + uVar23);
      uVar18 = 0;
      if (uVar10 != 0) {
        for (; (uVar10 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
        }
      }
      iVar11 = (int)uVar23 + ((uint)(uVar18 >> 3) & 0x1fffffff);
      goto LAB_001f2928;
    }
    goto LAB_001f28ab;
  }
  bVar4 = false;
  iVar11 = 6;
  __src = plVar24;
  goto LAB_001f27c6;
code_r0x001f2803:
  lVar20 = uVar23 + 8;
  uVar23 = uVar23 + 8;
  if (plVar1 < (long *)((long)plVar15 + lVar20)) goto code_r0x001f2814;
  goto LAB_001f27f2;
code_r0x001f2814:
  plVar15 = (long *)((long)plVar15 + uVar23);
LAB_001f2817:
  iVar11 = (int)uVar23;
  if (plVar15 < plVar2) {
    uVar23 = uVar23 & 0xffffffff;
    iVar11 = (iVar11 + iVar19) - (int)plVar15;
    lVar20 = 0;
    do {
      if (pcVar7[uVar23 + 4] != *(char *)((long)plVar15 + lVar20)) {
        iVar11 = (int)uVar23;
        break;
      }
      uVar23 = uVar23 + 1;
      lVar20 = lVar20 + 1;
    } while ((long)plVar2 - (long)plVar15 != lVar20);
  }
LAB_001f291b:
  uVar14 = iVar11 + 4;
  goto LAB_001f2a4e;
code_r0x001f2897:
  lVar20 = uVar23 + 8;
  uVar23 = uVar23 + 8;
  if (plVar1 < (long *)((long)plVar15 + lVar20)) goto code_r0x001f28a8;
  goto LAB_001f2885;
code_r0x001f28a8:
  plVar15 = (long *)((long)plVar15 + uVar23);
LAB_001f28ab:
  iVar11 = (int)uVar23;
  if (plVar15 < plVar2) {
    uVar23 = uVar23 & 0xffffffff;
    iVar11 = (iVar11 + iVar19) - (int)plVar15;
    lVar20 = 0;
    do {
      if (pcVar7[uVar23 + 4] != *(char *)((long)plVar15 + lVar20)) {
        iVar11 = (int)uVar23;
        break;
      }
      uVar23 = uVar23 + 1;
      lVar20 = lVar20 + 1;
    } while ((long)plVar2 - (long)plVar15 != lVar20);
  }
LAB_001f2928:
  plVar15 = (long *)((long)__src + 1);
  uVar18 = (ulong)((uint)((ulong)(*(long *)((long)__src + 1) * 0xcf1bbcdcbfa563) >> 0x31) & uVar8);
  unaff_R13 = input + *(ushort *)(uVar18 + (long)table2);
  uVar23 = 0;
  plVar16 = plVar15;
  if (plVar15 <= plVar1) {
    uVar23 = 0;
LAB_001f296a:
    if (*(ulong *)((long)plVar15 + uVar23) == *(ulong *)(unaff_R13 + uVar23)) goto code_r0x001f2989;
    uVar21 = *(ulong *)(unaff_R13 + uVar23) ^ *(ulong *)((long)plVar15 + uVar23);
    uVar10 = 0;
    if (uVar21 != 0) {
      for (; (uVar21 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
      }
    }
    uVar10 = (ulong)((int)uVar23 + ((uint)(uVar10 >> 3) & 0x1fffffff));
    goto LAB_001f2a1c;
  }
LAB_001f29a6:
  uVar10 = uVar23;
  if (plVar16 < plVar2) {
    uVar21 = uVar23 & 0xffffffff;
    lVar20 = 0;
    do {
      uVar10 = uVar21;
      if (unaff_R13[uVar21] != *(char *)((long)plVar16 + lVar20)) break;
      uVar21 = uVar21 + 1;
      lVar20 = lVar20 + 1;
      uVar10 = (ulong)(uint)(((int)uVar23 + iVar19) - (int)plVar16);
    } while ((long)plVar2 - (long)plVar16 != lVar20);
  }
LAB_001f2a1c:
  uVar14 = iVar11 + 4;
  if ((ulong)uVar14 < (ulong)(long)(int)uVar10) {
    *(short *)((long)table2 + uVar18) = sVar5;
    bVar4 = false;
    unaff_RBP = uVar10 & 0xffffffff;
    iVar11 = 5;
    __src = plVar15;
  }
  else {
LAB_001f2a4e:
    unaff_R13 = pcVar7;
    unaff_RBP = (ulong)uVar14;
    bVar4 = false;
    iVar11 = 5;
  }
LAB_001f27c6:
  uVar25 = (ulong)((int)uVar25 + 1);
  if (iVar11 != 0) goto LAB_001f2a59;
  goto LAB_001f2758;
code_r0x001f2989:
  lVar20 = uVar23 + 8;
  uVar23 = uVar23 + 8;
  if (plVar1 < (long *)((long)plVar15 + lVar20)) goto code_r0x001f29a0;
  goto LAB_001f296a;
code_r0x001f29a0:
  plVar16 = (long *)(uVar23 + (long)plVar15);
  goto LAB_001f29a6;
LAB_001f2a59:
  if (iVar11 == 5) {
    if ((plVar24 < __src) && (input < unaff_R13)) {
      while( true ) {
        plVar15 = (long *)((long)__src + -1);
        pcVar7 = unaff_R13 + -1;
        if (*(char *)plVar15 != *pcVar7) break;
        unaff_RBP = (ulong)((int)unaff_RBP + 1);
        __src = plVar15;
        unaff_R13 = pcVar7;
        if ((plVar15 <= plVar24) || (pcVar7 <= input)) break;
      }
    }
    sVar5 = (short)__src - (short)input;
    sVar6 = sVar5 + 1;
    *(short *)((ulong)((uint)((ulong)(*(long *)((long)__src + 1) * 0xcf1bbcdcbfa563) >> 0x31) &
                      uVar8) + (long)table2) = sVar6;
    *(short *)((ulong)((uint)((ulong)(*(long *)((long)__src + 2) * 0xcf1bbcdcbfa563) >> 0x31) &
                      uVar8) + (long)table2) = sVar5 + 2;
    *(short *)((ulong)((uint)(*(int *)((long)__src + 1) * -0x61c8864f) >> 0x11 & uVar8) +
              (long)table) = sVar6;
    puVar22 = (uint *)op;
    if (0 < (long)__src - (long)plVar24) {
      uVar14 = (uint)((long)__src - (long)plVar24);
      uVar12 = uVar14 - 1;
      if ((int)uVar14 < 0x11) {
        *op = (char)uVar12 << 2;
        lVar26 = plVar24[1];
        *(long *)((long)op + 1) = *plVar24;
        *(long *)((long)op + 9) = lVar26;
        puVar22 = (uint *)((long)op + (long)(int)uVar14 + 1);
      }
      else {
        if ((int)uVar14 < 0x3d) {
          *op = (char)uVar12 << 2;
        }
        else {
          uVar9 = 0x1f;
          if (uVar12 != 0) {
            for (; uVar12 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          uVar9 = -(uint)(uVar12 == 0) | (uVar9 ^ 0x18) >> 3 ^ 3;
          *op = (char)uVar9 * '\x04' + -0x10;
          *(uint *)((long)op + 1) = uVar12;
          op = (char *)((long)op + (long)(int)uVar9 + 1);
        }
        puVar22 = (uint *)((long)op + (ulong)(uVar14 & 0x7fffffff) + 1);
        puVar17 = (uint *)((long)op + 1);
        do {
          lVar26 = plVar24[1];
          *(long *)puVar17 = *plVar24;
          *(long *)(puVar17 + 2) = lVar26;
          puVar17 = puVar17 + 4;
          plVar24 = plVar24 + 2;
        } while (puVar17 < puVar22);
      }
    }
LAB_001f2bdb:
    uVar14 = (uint)unaff_RBP;
    uVar25 = unaff_RBP & 0xffffffff;
    uVar23 = (long)__src - (long)unaff_R13;
    iVar11 = (int)uVar23;
    if (uVar14 < 0xc) {
      iVar13 = ((uint)(uVar23 >> 3) & 0xe0) - 0xf;
      if (0x7ff < uVar23) {
        iVar13 = -2;
      }
      uVar14 = iVar13 + (iVar11 << 8 | uVar14 * 4);
LAB_001f2c87:
      *puVar22 = uVar14;
      puVar22 = (uint *)((long)puVar22 + (3 - (ulong)(uVar23 < 0x800)));
    }
    else {
      uVar18 = uVar25;
      if (0x43 < uVar14) {
        do {
          *puVar22 = iVar11 << 8 | 0xfe;
          puVar22 = (uint *)((long)puVar22 + 3);
          uVar18 = uVar18 - 0x40;
        } while (0x43 < uVar18);
      }
      if (0x40 < uVar18) {
        *puVar22 = iVar11 << 8 | 0xee;
        puVar22 = (uint *)((long)puVar22 + 3);
        uVar18 = uVar18 - 0x3c;
      }
      uVar14 = (int)uVar18 * 4;
      if (uVar18 < 0xc) {
        iVar13 = ((uint)(uVar23 >> 3) & 0xe0) - 0xf;
        if (0x7ff < uVar23) {
          iVar13 = -2;
        }
        uVar14 = iVar13 + (uVar14 | iVar11 * 0x100);
        goto LAB_001f2c87;
      }
      *puVar22 = (iVar11 * 0x100 + uVar14) - 2;
      puVar22 = (uint *)((long)puVar22 + 3);
    }
    __src = (long *)((long)__src + uVar25);
    if (__src < (long *)((long)plVar2 - 0xfU)) {
      sVar5 = (short)((long)__src - (long)input);
      if (7 < (long)__src - (long)input) {
        *(short *)((ulong)((uint)((ulong)(*(long *)((long)__src + -7) * 0xcf1bbcdcbfa563) >> 0x31) &
                          uVar8) + (long)table2) = sVar5 + -7;
        *(short *)((ulong)((uint)((ulong)(*(long *)((long)__src + -4) * 0xcf1bbcdcbfa563) >> 0x31) &
                          uVar8) + (long)table2) = sVar5 + -4;
      }
      *(short *)((ulong)((uint)((ulong)(*(long *)((long)__src + -3) * 0xcf1bbcdcbfa563) >> 0x31) &
                        uVar8) + (long)table2) = sVar5 + -3;
      *(short *)((ulong)((uint)((ulong)(*(long *)((long)__src + -2) * 0xcf1bbcdcbfa563) >> 0x31) &
                        uVar8) + (long)table2) = sVar5 + -2;
      *(short *)((ulong)((uint)(*(int *)((long)__src + -2) * -0x61c8864f) >> 0x11 & uVar8) +
                (long)table) = sVar5 + -2;
      *(short *)((ulong)((uint)(*(int *)((long)__src + -1) * -0x61c8864f) >> 0x11 & uVar8) +
                (long)table) = sVar5 + -1;
      uVar25 = (ulong)((uint)((ulong)(*__src * 0xcf1bbcdcbfa563) >> 0x31) & uVar8);
      uVar3 = *(ushort *)(uVar25 + (long)table2);
      *(short *)(uVar25 + (long)table2) = sVar5;
      if ((int)*__src == *(int *)(input + uVar3)) {
        unaff_R13 = input + uVar3;
        plVar24 = (long *)((long)__src + 4);
        uVar25 = 0;
        if (plVar24 <= plVar1) {
          uVar25 = 0;
          do {
            uVar23 = *(ulong *)((long)plVar24 + uVar25);
            uVar18 = *(ulong *)(unaff_R13 + uVar25 + 4);
            if (uVar23 != uVar18) goto LAB_001f2e6c;
            lVar26 = uVar25 + 8;
            uVar25 = uVar25 + 8;
          } while ((long *)((long)plVar24 + lVar26) <= plVar1);
          plVar24 = (long *)((long)plVar24 + uVar25);
        }
        iVar11 = (int)uVar25;
        if (plVar24 < plVar2) {
          uVar25 = uVar25 & 0xffffffff;
          iVar11 = (iVar11 + iVar19) - (int)plVar24;
          lVar26 = 0;
          do {
            if (unaff_R13[uVar25 + 4] != *(char *)((long)plVar24 + lVar26)) goto LAB_001f2e7a;
            uVar25 = uVar25 + 1;
            lVar26 = lVar26 + 1;
          } while ((long)plVar2 - (long)plVar24 != lVar26);
        }
      }
      else {
        uVar25 = (ulong)((uint)((int)*__src * -0x61c8864f) >> 0x11 & uVar8);
        uVar3 = *(ushort *)(uVar25 + (long)table);
        unaff_R13 = input + uVar3;
        *(short *)(uVar25 + (long)table) = sVar5;
        if ((int)*__src != *(int *)(input + uVar3)) {
          iVar11 = 9;
          goto LAB_001f2e81;
        }
        plVar24 = (long *)((long)__src + 4);
        uVar25 = 0;
        if (plVar24 <= plVar1) {
          uVar25 = 0;
          do {
            uVar23 = *(ulong *)((long)plVar24 + uVar25);
            uVar18 = *(ulong *)(unaff_R13 + uVar25 + 4);
            if (uVar23 != uVar18) goto LAB_001f2e6c;
            lVar26 = uVar25 + 8;
            uVar25 = uVar25 + 8;
          } while ((long *)((long)plVar24 + lVar26) <= plVar1);
          plVar24 = (long *)((long)plVar24 + uVar25);
        }
        iVar11 = (int)uVar25;
        if (plVar24 < plVar2) {
          uVar25 = uVar25 & 0xffffffff;
          iVar11 = (iVar11 + iVar19) - (int)plVar24;
          lVar26 = 0;
          do {
            if (unaff_R13[uVar25 + 4] != *(char *)((long)plVar24 + lVar26)) goto LAB_001f2e7a;
            uVar25 = uVar25 + 1;
            lVar26 = lVar26 + 1;
          } while ((long)plVar2 - (long)plVar24 != lVar26);
        }
      }
      goto LAB_001f2e7c;
    }
    iVar11 = 6;
    goto LAB_001f2e81;
  }
LAB_001f2e96:
  plVar24 = __src;
  if (!bVar4) goto LAB_001f2ea1;
  goto LAB_001f2745;
LAB_001f2e6c:
  uVar10 = 0;
  if ((uVar18 ^ uVar23) != 0) {
    for (; ((uVar18 ^ uVar23) >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
    }
  }
  iVar11 = (int)uVar25 + ((uint)(uVar10 >> 3) & 0x1fffffff);
LAB_001f2e7c:
  unaff_RBP = (ulong)(iVar11 + 4);
  iVar11 = 10;
LAB_001f2e81:
  if (iVar11 != 10) goto code_r0x001f2e8b;
  goto LAB_001f2bdb;
LAB_001f2e7a:
  iVar11 = (int)uVar25;
  goto LAB_001f2e7c;
code_r0x001f2e8b:
  op = (char *)puVar22;
  if (iVar11 == 9) {
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
  goto LAB_001f2e96;
}

Assistant:

char* CompressFragmentDoubleHash(const char* input, size_t input_size, char* op,
                                 uint16_t* table, const int table_size,
                                 uint16_t* table2, const int table_size2) {
  (void)table_size2;
  assert(table_size == table_size2);
  // "ip" is the input pointer, and "op" is the output pointer.
  const char* ip = input;
  assert(input_size <= kBlockSize);
  assert((table_size & (table_size - 1)) == 0);  // table must be power of two
  const uint32_t mask = 2 * (table_size - 1);
  const char* ip_end = input + input_size;
  const char* base_ip = ip;

  const size_t kInputMarginBytes = 15;
  if (SNAPPY_PREDICT_TRUE(input_size >= kInputMarginBytes)) {
    const char* ip_limit = input + input_size - kInputMarginBytes;

    for (;;) {
      const char* next_emit = ip++;
      uint64_t data = LittleEndian::Load64(ip);
      uint32_t skip = 512;

      const char* candidate;
      uint32_t candidate_length;
      while (true) {
        assert(static_cast<uint32_t>(data) == LittleEndian::Load32(ip));
        uint16_t* table_entry2 = TableEntry8ByteMatch(table2, data, mask);
        uint32_t bytes_between_hash_lookups = skip >> 9;
        skip++;
        const char* next_ip = ip + bytes_between_hash_lookups;
        if (SNAPPY_PREDICT_FALSE(next_ip > ip_limit)) {
          ip = next_emit;
          goto emit_remainder;
        }
        candidate = base_ip + *table_entry2;
        assert(candidate >= base_ip);
        assert(candidate < ip);

        *table_entry2 = ip - base_ip;
        if (SNAPPY_PREDICT_FALSE(static_cast<uint32_t>(data) ==
                                LittleEndian::Load32(candidate))) {
          candidate_length =
              FindMatchLengthPlain(candidate + 4, ip + 4, ip_end) + 4;
          break;
        }

        uint16_t* table_entry = TableEntry4ByteMatch(table, data, mask);
        candidate = base_ip + *table_entry;
        assert(candidate >= base_ip);
        assert(candidate < ip);

        *table_entry = ip - base_ip;
        if (SNAPPY_PREDICT_FALSE(static_cast<uint32_t>(data) ==
                                LittleEndian::Load32(candidate))) {
          candidate_length =
              FindMatchLengthPlain(candidate + 4, ip + 4, ip_end) + 4;
          table_entry2 =
              TableEntry8ByteMatch(table2, LittleEndian::Load64(ip + 1), mask);
          auto candidate2 = base_ip + *table_entry2;
          size_t candidate_length2 =
              FindMatchLengthPlain(candidate2, ip + 1, ip_end);
          if (candidate_length2 > candidate_length) {
            *table_entry2 = ip - base_ip;
            candidate = candidate2;
            candidate_length = candidate_length2;
            ++ip;
          }
          break;
        }
        data = LittleEndian::Load64(next_ip);
        ip = next_ip;
      }
      // Backtrack to the point it matches fully.
      while (ip > next_emit && candidate > base_ip &&
             *(ip - 1) == *(candidate - 1)) {
        --ip;
        --candidate;
        ++candidate_length;
      }
      *TableEntry8ByteMatch(table2, LittleEndian::Load64(ip + 1), mask) =
          ip - base_ip + 1;
      *TableEntry8ByteMatch(table2, LittleEndian::Load64(ip + 2), mask) =
          ip - base_ip + 2;
      *TableEntry4ByteMatch(table, LittleEndian::Load32(ip + 1), mask) =
          ip - base_ip + 1;
      // Step 2: A 4-byte or 8-byte match has been found.
      // We'll later see if more than 4 bytes match.  But, prior to the match,
      // input bytes [next_emit, ip) are unmatched.  Emit them as
      // "literal bytes."
      assert(next_emit + 16 <= ip_end);
      if (ip - next_emit > 0) {
        op = EmitLiteral</*allow_fast_path=*/true>(op, next_emit,
                                                   ip - next_emit);
      }
      // Step 3: Call EmitCopy, and then see if another EmitCopy could
      // be our next move.  Repeat until we find no match for the
      // input immediately after what was consumed by the last EmitCopy call.
      //
      // If we exit this loop normally then we need to call EmitLiteral next,
      // though we don't yet know how big the literal will be.  We handle that
      // by proceeding to the next iteration of the main loop.  We also can exit
      // this loop via goto if we get close to exhausting the input.
      do {
        // We have a 4-byte match at ip, and no need to emit any
        // "literal bytes" prior to ip.
        const char* base = ip;
        ip += candidate_length;
        size_t offset = base - candidate;
        if (candidate_length < 12) {
          op =
              EmitCopy</*len_less_than_12=*/true>(op, offset, candidate_length);
        } else {
          op = EmitCopy</*len_less_than_12=*/false>(op, offset,
                                                    candidate_length);
        }
        if (SNAPPY_PREDICT_FALSE(ip >= ip_limit)) {
          goto emit_remainder;
        }
        // We are now looking for a 4-byte match again.  We read
        // table[Hash(ip, mask)] for that. To improve compression,
        // we also update several previous table entries.
        if (ip - base_ip > 7) {
          *TableEntry8ByteMatch(table2, LittleEndian::Load64(ip - 7), mask) =
              ip - base_ip - 7;
          *TableEntry8ByteMatch(table2, LittleEndian::Load64(ip - 4), mask) =
              ip - base_ip - 4;
        }
        *TableEntry8ByteMatch(table2, LittleEndian::Load64(ip - 3), mask) =
            ip - base_ip - 3;
        *TableEntry8ByteMatch(table2, LittleEndian::Load64(ip - 2), mask) =
            ip - base_ip - 2;
        *TableEntry4ByteMatch(table, LittleEndian::Load32(ip - 2), mask) =
            ip - base_ip - 2;
        *TableEntry4ByteMatch(table, LittleEndian::Load32(ip - 1), mask) =
            ip - base_ip - 1;

        uint16_t* table_entry =
            TableEntry8ByteMatch(table2, LittleEndian::Load64(ip), mask);
        candidate = base_ip + *table_entry;
        *table_entry = ip - base_ip;
        if (LittleEndian::Load32(ip) == LittleEndian::Load32(candidate)) {
          candidate_length =
              FindMatchLengthPlain(candidate + 4, ip + 4, ip_end) + 4;
          continue;
        }
        table_entry =
            TableEntry4ByteMatch(table, LittleEndian::Load32(ip), mask);
        candidate = base_ip + *table_entry;
        *table_entry = ip - base_ip;
        if (LittleEndian::Load32(ip) == LittleEndian::Load32(candidate)) {
          candidate_length =
              FindMatchLengthPlain(candidate + 4, ip + 4, ip_end) + 4;
          continue;
        }
        break;
      } while (true);
    }
  }

emit_remainder:
  // Emit the remaining bytes as a literal
  if (ip < ip_end) {
    op = EmitLiteral</*allow_fast_path=*/false>(op, ip, ip_end - ip);
  }

  return op;
}